

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int fill_cmd_string(nt_opts *opts,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  int local_48;
  int skip;
  int has_space;
  int ac;
  int c;
  int remain;
  int len;
  char *cp;
  char **argv_local;
  int argc_local;
  nt_opts *opts_local;
  
  local_48 = 0;
  iVar2 = sprintf(opts->command,"\n  command: %s",*argv);
  _remain = opts->command + iVar2;
  ac = 0x800 - iVar2;
  skip = 1;
  do {
    if (argc <= skip) {
      if ((1 < g_debug) &&
         (fprintf(_stderr,"+d filled command string, %d args, %d bytes\n",(ulong)(uint)argc,
                  (ulong)(uint)((int)_remain - ((int)opts + 0x100))), 2 < g_debug)) {
        fprintf(_stderr,"%s\n",opts->command);
      }
      return 0;
    }
    if (local_48 == 0) {
      sVar3 = strlen(argv[skip]);
      if (ac <= (int)sVar3 + 3) {
        fprintf(_stderr,"FCS: no space remaining for command, continuing...\n");
        return 1;
      }
      bVar1 = false;
      for (has_space = 0; has_space < (int)sVar3 + -1; has_space = has_space + 1) {
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)argv[skip][has_space]] & 0x2000) != 0) {
          bVar1 = true;
          break;
        }
      }
      if (bVar1) {
        c = sprintf(_remain," \'%s\'",argv[skip]);
      }
      else {
        c = sprintf(_remain," %s",argv[skip]);
      }
      ac = ac - c;
      iVar2 = strncmp(argv[skip + -1],"-infiles",3);
      if ((iVar2 == 0) && (4 < (opts->infiles).len)) {
        local_48 = (opts->infiles).len + -2;
      }
      _remain = _remain + c;
    }
    else {
      local_48 = local_48 + -1;
    }
    skip = skip + 1;
  } while( true );
}

Assistant:

int fill_cmd_string( nt_opts * opts, int argc, char * argv[])
{
   char * cp;
   int    len, remain = NT_CMD_LEN;  /* NT_CMD_LEN is max command len */
   int    c, ac;
   int    has_space;  /* arguments containing space must be quoted */
   int    skip = 0;   /* counter to skip some of the arguments     */

   /* get the first argument separately */
   len = sprintf( opts->command, "\n  command: %s", argv[0] );
   cp = opts->command + len;
   remain -= len;

   /* get the rest, with special attention to input files */
   for( ac = 1; ac < argc; ac++ )
   {
      if( skip ){ skip--;  continue; }  /* then skip these arguments */

      len = strlen(argv[ac]);
      if( len + 3 >= remain ) {  /* extra 3 for space and possible '' */
         fprintf(stderr,"FCS: no space remaining for command, continuing...\n");
         return 1;
      }

      /* put the argument in, possibly with '' */

      has_space = 0;
      for( c = 0; c < len-1; c++ )
         if( isspace(argv[ac][c]) ){ has_space = 1; break; }
      if( has_space ) len = sprintf(cp, " '%s'", argv[ac]);
      else            len = sprintf(cp, " %s",   argv[ac]);

      remain -= len;

      /* infiles is okay, but after the *next* argument, we may skip files */
      /* (danger, will robinson!  hack alert!) */
      if( !strncmp(argv[ac-1],"-infiles",3) )
      {
         /* if more than 4 (just to be arbitrary) input files,
            include only the first and last */
         if( opts->infiles.len > 4 )
            skip = opts->infiles.len - 2;
      }

      cp += len;
   }

   if( g_debug > 1 ){
      fprintf(stderr,"+d filled command string, %d args, %d bytes\n",
              argc, (int)(cp - opts->command));
      if( g_debug > 2 ) fprintf(stderr,"%s\n", opts->command);
   }

   return 0;
}